

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ExcludesError::~ExcludesError(ExcludesError *this)

{
  ExcludesError *this_local;
  
  ~ExcludesError(this);
  operator_delete(this);
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}